

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O2

TPZAutoPointer<TPZSavable> __thiscall
TPZPersistenceManager::GetAutoPointer(TPZPersistenceManager *this,int64_t *objId)

{
  bool bVar1;
  TPZReference *in_RAX;
  TPZSavable *pTVar2;
  size_t sVar3;
  TPZAutoPointer<TPZSavable> autoPointer;
  TPZAutoPointer<TPZSavable> local_28;
  
  local_28.fRef = in_RAX;
  TPZAutoPointer<TPZSavable>::TPZAutoPointer(&local_28);
  if (*objId == -1) {
    *(TPZReference **)this = local_28.fRef;
    local_28.fRef = (TPZReference *)0x0;
  }
  else {
    bVar1 = TPZRestoredInstance::IsAlreadyRead(mObjVec.fStore + *objId);
    if (!bVar1) {
      TPZRestoredInstance::SetRead(mObjVec.fStore + *objId);
      pTVar2 = TPZRestoredInstance::GetPointerToMyObj(mObjVec.fStore + *objId);
      (*pTVar2->_vptr_TPZSavable[6])
                (pTVar2,&(mChunksVec.fStore[*objId].fRef)->fPointer->mNewStream,0);
      sVar3 = TPZContBufferedStream::Size(&(mChunksVec.fStore[*objId].fRef)->fPointer->mNewStream);
      if (sVar3 != 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZPersistenceManager.cpp"
                   ,0x1d0);
      }
    }
    TPZRestoredInstance::GetAutoPointerToMyObj((TPZRestoredInstance *)this);
  }
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_28);
  return (TPZAutoPointer<TPZSavable>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZSavable> TPZPersistenceManager::GetAutoPointer(const int64_t &objId) {
    TPZAutoPointer<TPZSavable> autoPointer;
    if (objId != -1) {
        if (!mObjVec[objId].IsAlreadyRead()) {
            mObjVec[objId].SetRead();
            mObjVec[objId].GetPointerToMyObj()->Read(mChunksVec[objId]->mNewStream, NULL);
            if (mChunksVec[objId]->mNewStream.Size() != 0) {
                DebugStop();
            }
        }
        return mObjVec[objId].GetAutoPointerToMyObj();
    }
    return autoPointer;
}